

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reverse_levinson_durbin_recursion.cc
# Opt level: O2

bool __thiscall
sptk::ReverseLevinsonDurbinRecursion::Run
          (ReverseLevinsonDurbinRecursion *this,
          vector<double,_std::allocator<double>_> *linear_predictive_coefficients,
          vector<double,_std::allocator<double>_> *autocorrelation,Buffer *buffer)

{
  SymmetricMatrix *this_00;
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  double *pdVar6;
  double *pdVar7;
  long lVar8;
  int j;
  int iVar9;
  size_type sVar10;
  double *pdVar11;
  size_type __new_size;
  double local_80;
  Row local_78;
  pointer local_60;
  long local_58;
  ReverseLevinsonDurbinRecursion *local_50;
  double local_48;
  double *local_40;
  long local_38;
  
  if (this->is_valid_ == true) {
    bVar5 = false;
    if ((buffer != (Buffer *)0x0) &&
       (bVar5 = false, autocorrelation != (vector<double,_std::allocator<double>_> *)0x0)) {
      lVar8 = (long)(linear_predictive_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(linear_predictive_coefficients->
                    super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
      sVar10 = (long)this->num_order_ + 1;
      __new_size = lVar8 >> 3;
      bVar5 = false;
      if (__new_size == sVar10) {
        local_50 = this;
        if ((long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start != lVar8) {
          std::vector<double,_std::allocator<double>_>::resize(autocorrelation,__new_size);
        }
        this_00 = &buffer->u_;
        iVar9 = (int)sVar10;
        if ((buffer->u_).num_dimension_ != iVar9) {
          SymmetricMatrix::Resize(this_00,iVar9);
        }
        local_60 = (buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
        if ((long)(buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)local_60 != lVar8) {
          std::vector<double,_std::allocator<double>_>::resize(&buffer->e_,__new_size);
          local_60 = (buffer->e_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        }
        pdVar7 = (linear_predictive_coefficients->
                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar11 = (autocorrelation->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (iVar9 = 0; local_78.row_ = local_50->num_order_, iVar9 <= local_78.row_;
            iVar9 = iVar9 + 1) {
          local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
          local_78.matrix_ = this_00;
          local_78.row_ = iVar9;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_78,iVar9);
          *pdVar6 = 1.0;
        }
        lVar8 = 0;
        for (iVar9 = 0; iVar9 < local_78.row_; iVar9 = iVar9 + 1) {
          dVar2 = pdVar7[local_78.row_ + lVar8];
          local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
          local_78.matrix_ = this_00;
          pdVar6 = SymmetricMatrix::Row::operator[](&local_78,iVar9);
          *pdVar6 = dVar2;
          local_78.row_ = local_50->num_order_;
          lVar8 = lVar8 + -1;
        }
        lVar8 = (long)local_78.row_;
        dVar2 = *pdVar7;
        local_60[lVar8] = dVar2 * dVar2;
        local_58 = lVar8 * 8;
        local_40 = pdVar11;
        while (pdVar7 = local_40, local_58 = local_58 + -8, 0 < lVar8) {
          lVar1 = lVar8 + -1;
          local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
          local_78.row_ = (int)lVar8;
          local_78.matrix_ = this_00;
          local_38 = lVar8;
          pdVar7 = SymmetricMatrix::Row::operator[](&local_78,0);
          local_48 = 1.0 / (1.0 - *pdVar7 * *pdVar7);
          pdVar11 = (double *)((long)pdVar7 + local_58);
          for (lVar8 = 0; lVar8 < lVar1; lVar8 = lVar8 + 1) {
            dVar2 = pdVar7[lVar8 + 1];
            dVar3 = *pdVar7;
            dVar4 = *pdVar11;
            local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
            local_78.row_ = (int)lVar1;
            local_78.matrix_ = this_00;
            pdVar6 = SymmetricMatrix::Row::operator[](&local_78,(int)lVar8);
            *pdVar6 = (dVar2 - dVar3 * dVar4) * local_48;
            pdVar11 = pdVar11 + -1;
          }
          local_60[lVar1] = local_48 * local_60[local_38];
          lVar8 = lVar1;
        }
        *local_40 = *local_60;
        local_58 = 0;
        local_48 = 4.94065645841247e-324;
        while ((long)local_48 <= (long)local_50->num_order_) {
          iVar9 = SUB84(local_48,0);
          local_80 = 0.0;
          lVar8 = local_58;
          while (dVar2 = local_48, lVar8 != 0) {
            local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
            local_78.matrix_ = this_00;
            local_78.row_ = iVar9 + -1;
            pdVar11 = SymmetricMatrix::Row::operator[](&local_78,(int)(lVar8 + -1));
            local_80 = local_80 + *pdVar11 * pdVar7[lVar8];
            lVar8 = lVar8 + -1;
          }
          local_78._vptr_Row = (_func_int **)&PTR__Row_0010fd30;
          local_78.row_ = SUB84(local_48,0);
          local_78.matrix_ = this_00;
          pdVar11 = SymmetricMatrix::Row::operator[](&local_78,0);
          pdVar7[(long)dVar2] = -(*pdVar11 * local_60[(long)dVar2 + -1] + local_80);
          local_58 = local_58 + 1;
          local_48 = (double)((long)dVar2 + 1);
        }
        bVar5 = true;
      }
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ReverseLevinsonDurbinRecursion::Run(
    const std::vector<double>& linear_predictive_coefficients,
    std::vector<double>* autocorrelation,
    ReverseLevinsonDurbinRecursion::Buffer* buffer) const {
  // Check inputs.
  const int length(num_order_ + 1);
  if (!is_valid_ ||
      linear_predictive_coefficients.size() !=
          static_cast<std::size_t>(length) ||
      NULL == autocorrelation || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (autocorrelation->size() != static_cast<std::size_t>(length)) {
    autocorrelation->resize(length);
  }
  if (buffer->u_.GetNumDimension() != length) {
    buffer->u_.Resize(length);
  }
  if (buffer->e_.size() != static_cast<std::size_t>(length)) {
    buffer->e_.resize(length);
  }

  const double* a(&(linear_predictive_coefficients[0]));
  double* r(&((*autocorrelation)[0]));
  double* e(&(buffer->e_[0]));

  for (int j(0); j <= num_order_; ++j) {
    buffer->u_[j][j] = 1.0;
  }
  for (int j(0); j < num_order_; ++j) {
    buffer->u_[num_order_][j] = a[num_order_ - j];
  }
  e[num_order_] = a[0] * a[0];

  for (int i(num_order_ - 1); 0 <= i; --i) {
    const double* u(&(buffer->u_[i + 1][0]));
    const double t(1.0 / (1.0 - u[0] * u[0]));
    for (int j(0); j < i; ++j) {
      buffer->u_[i][j] = (u[j + 1] - u[0] * u[i - j]) * t;
    }
    e[i] = e[i + 1] * t;
  }

  r[0] = e[0];
  for (int i(1); i <= num_order_; ++i) {
    double sum(0.0);
    for (int j(1); j < i; ++j) {
      sum += buffer->u_[i - 1][i - j - 1] * r[i - j];
    }
    r[i] = -(sum + buffer->u_[i][0] * e[i - 1]);
  }

  return true;
}